

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O2

void __thiscall
boomphf::mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>::
processLevel<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *input_range,int i)

{
  shared_ptr<void> *this_00;
  shared_ptr<void> *this_01;
  int iVar1;
  FILE *pFVar2;
  pthread_t *ppVar3;
  ulong uVar4;
  int ii;
  int iVar5;
  long lVar6;
  pthread_t *ppVar7;
  int ii_1;
  __shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> local_c90;
  int local_c7c;
  undefined1 local_c78 [16];
  file_binary<unsigned_long> data_iterator_level;
  bfile_iterator<unsigned_long> local_c60;
  thread_args<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,___gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  t_arg;
  char fname_prev [1000];
  char fname_old [1000];
  char fname_curr [1000];
  
  bitVector::bitVector((bitVector *)fname_old,*(uint64_t *)(*(long *)this + 8 + (long)i * 0x40));
  bitVector::operator=((bitVector *)(*(long *)this + (long)i * 0x40 + 0x10),(bitVector *)fname_old);
  bitVector::~bitVector((bitVector *)fname_old);
  sprintf(fname_old,"temp_p%i_level_%i",(ulong)*(uint *)(this + 0x260),(ulong)(i - 2));
  sprintf(fname_curr,"temp_p%i_level_%i",(ulong)*(uint *)(this + 0x260),(ulong)(uint)i);
  sprintf(fname_prev,"temp_p%i_level_%i",(ulong)*(uint *)(this + 0x260),(ulong)(i - 1));
  if (this[0x256] == (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x1) {
    if (2 < i) {
      unlink(fname_old);
    }
    if ((0 < i) && (i < *(int *)(this + 0x18) + -1)) {
      pFVar2 = fopen(fname_curr,"w");
      *(FILE **)(this + 600) = pFVar2;
    }
  }
  *(undefined8 *)(this + 0x1e8) = 0;
  *(undefined4 *)(this + 0x1e0) = 0;
  *(undefined8 *)(this + 0x200) = 0;
  *(undefined8 *)(this + 0x208) = 0;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (long)*(int *)(this + 0x1e4)) {
    uVar4 = (long)*(int *)(this + 0x1e4) * 8;
  }
  local_c7c = i;
  ppVar3 = (pthread_t *)operator_new__(uVar4);
  t_arg.until_p.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  t_arg.until_p.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  t_arg.it_p.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  t_arg.it_p.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c78._0_8_ =
       (input_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start;
  t_arg.boophf = this;
  t_arg.range = input_range;
  std::
  make_shared<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)&local_c90);
  this_00 = &t_arg.it_p;
  std::
  static_pointer_cast<void,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((shared_ptr<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              *)&local_c60);
  std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)&local_c60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c60._is);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c90._M_refcount);
  local_c78._0_8_ =
       (input_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  std::
  make_shared<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)&local_c90);
  std::
  static_pointer_cast<void,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((shared_ptr<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              *)&local_c60);
  this_01 = &t_arg.until_p;
  std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_01->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)&local_c60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c60._is);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c90._M_refcount);
  t_arg.level = local_c7c;
  if ((local_c7c < 2) ||
     (this[0x256] == (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x0)) {
    if ((this[0x21c] == (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x1) &&
       (*(int *)(this + 0x250) < local_c7c)) {
      local_c78._0_8_ = *(undefined8 *)(this + 0x220);
      std::
      make_shared<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)&local_c90);
      std::
      static_pointer_cast<void,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)&local_c60);
      std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&this_00->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)&local_c60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c60._is);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c90._M_refcount);
      local_c78._0_8_ = *(undefined8 *)(this + 0x228);
      std::
      make_shared<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)&local_c90);
      std::
      static_pointer_cast<void,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)&local_c60);
      std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&this_01->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)&local_c60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c60._is);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c90._M_refcount);
      ppVar7 = ppVar3;
      for (lVar6 = 0; uVar4 = (ulong)*(int *)(this + 0x1e4), lVar6 < (long)uVar4; lVar6 = lVar6 + 1)
      {
        pthread_create(ppVar7,(pthread_attr_t *)0x0,
                       thread_processLevel<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>,std::vector<unsigned_long,std::allocator<unsigned_long>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                       ,&t_arg);
        ppVar7 = ppVar7 + 1;
      }
    }
    else {
      ppVar7 = ppVar3;
      for (lVar6 = 0; uVar4 = (ulong)*(int *)(this + 0x1e4), lVar6 < (long)uVar4; lVar6 = lVar6 + 1)
      {
        pthread_create(ppVar7,(pthread_attr_t *)0x0,
                       thread_processLevel<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>,std::vector<unsigned_long,std::allocator<unsigned_long>>,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                       ,&t_arg);
        ppVar7 = ppVar7 + 1;
      }
    }
    iVar5 = local_c7c;
    for (lVar6 = 0; lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
      pthread_join(ppVar3[lVar6],(void **)0x0);
      uVar4 = (ulong)*(uint *)(this + 0x1e4);
    }
  }
  else {
    file_binary<unsigned_long>::file_binary(&data_iterator_level,fname_prev);
    bfile_iterator<unsigned_long>::bfile_iterator(&local_c60,data_iterator_level._is);
    std::make_shared<boomphf::bfile_iterator<unsigned_long>,boomphf::bfile_iterator<unsigned_long>>
              ((bfile_iterator<unsigned_long> *)local_c78);
    std::static_pointer_cast<void,boomphf::bfile_iterator<unsigned_long>>
              ((shared_ptr<boomphf::bfile_iterator<unsigned_long>_> *)&local_c90);
    std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this_00->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>,&local_c90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c90._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c78 + 8));
    free(local_c60._buffer);
    bfile_iterator<unsigned_long>::bfile_iterator(&local_c60);
    std::make_shared<boomphf::bfile_iterator<unsigned_long>,boomphf::bfile_iterator<unsigned_long>>
              ((bfile_iterator<unsigned_long> *)local_c78);
    std::static_pointer_cast<void,boomphf::bfile_iterator<unsigned_long>>
              ((shared_ptr<boomphf::bfile_iterator<unsigned_long>_> *)&local_c90);
    std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this_01->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>,&local_c90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c90._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c78 + 8));
    free(local_c60._buffer);
    ppVar7 = ppVar3;
    for (lVar6 = 0; iVar5 = local_c7c, uVar4 = (ulong)*(int *)(this + 0x1e4), lVar6 < (long)uVar4;
        lVar6 = lVar6 + 1) {
      pthread_create(ppVar7,(pthread_attr_t *)0x0,
                     thread_processLevel<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>,std::vector<unsigned_long,std::allocator<unsigned_long>>,boomphf::bfile_iterator<unsigned_long>>
                     ,&t_arg);
      ppVar7 = ppVar7 + 1;
    }
    for (lVar6 = 0; lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
      pthread_join(ppVar3[lVar6],(void **)0x0);
      uVar4 = (ulong)*(uint *)(this + 0x1e4);
    }
    fclose((FILE *)data_iterator_level._is);
  }
  if ((this[0x21c] == (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x1) &&
     (*(int *)(this + 0x250) == iVar5)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x220),
               *(size_type *)(this + 0x200));
  }
  operator_delete__(ppVar3);
  if (this[0x256] == (mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>)0x1) {
    iVar1 = *(int *)(this + 0x18);
    if (0 < iVar5 && iVar5 < iVar1 + -1) {
      fflush(*(FILE **)(this + 600));
      fclose(*(FILE **)(this + 600));
      iVar1 = *(int *)(this + 0x18);
    }
    if (iVar1 + -1 == iVar5) {
      unlink(fname_prev);
    }
  }
  thread_args<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,___gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~thread_args(&t_arg);
  return;
}

Assistant:

void processLevel(Range const& input_range,int i)
		{
			////alloc the bitset for this level
			_levels[i].bitset =  bitVector(_levels[i].hash_domain); ;

			//printf("---process level %i   wr %i fast %i ---\n",i,_writeEachLevel,_fastmode);
			
			char fname_old[1000];
			sprintf(fname_old,"temp_p%i_level_%i",_pid,i-2);
			
			char fname_curr[1000];
			sprintf(fname_curr,"temp_p%i_level_%i",_pid,i);
			
			char fname_prev[1000];
			sprintf(fname_prev,"temp_p%i_level_%i",_pid,i-1);
			
			if(_writeEachLevel)
			{
				//file management :
				
				if(i>2) //delete previous file
				{
					unlink(fname_old);
				}
				
				if(i< _nb_levels-1 && i > 0 ) //create curr file
				{
					_currlevelFile = fopen(fname_curr,"w");
				}
			}
			
			
			_cptLevel = 0;
			_hashidx = 0;
			_idxLevelsetLevelFastmode =0;
			_nb_living =0;
			//create  threads
			pthread_t *tab_threads= new pthread_t [_num_thread];
			typedef decltype(input_range.begin()) it_type;
			thread_args<Range, it_type> t_arg; // meme arg pour tous
			t_arg.boophf = this;
			t_arg.range = &input_range;
			t_arg.it_p =  std::static_pointer_cast<void>(std::make_shared<it_type>(input_range.begin()));
			t_arg.until_p =  std::static_pointer_cast<void>(std::make_shared<it_type>(input_range.end()));


			t_arg.level = i;
			
			
			if(_writeEachLevel && (i > 1))
			{

				auto data_iterator_level = file_binary<elem_t>(fname_prev);
				
				typedef decltype(data_iterator_level.begin()) disklevel_it_type;
				
				//data_iterator_level.begin();
				t_arg.it_p = std::static_pointer_cast<void>(std::make_shared<disklevel_it_type>(data_iterator_level.begin()));
				t_arg.until_p = std::static_pointer_cast<void>(std::make_shared<disklevel_it_type>(data_iterator_level.end()));
				
				for(int ii=0;ii<_num_thread;ii++)
					pthread_create (&tab_threads[ii], NULL,  thread_processLevel<elem_t, Hasher_t, Range, disklevel_it_type>, &t_arg); //&t_arg[ii]
			
			
				//must join here before the block is closed and file_binary is destroyed (and closes the file)
				for(int ii=0;ii<_num_thread;ii++)
				{
					pthread_join(tab_threads[ii], NULL);
				}
				
			}
			
			else
			{
				if(_fastmode && i >= (_fastModeLevel+1))
				{

					/* we'd like to do t_arg.it = data_iterator.begin() but types are different;
					 so, casting to (void*) because of that; and we remember the type in the template */
					typedef decltype(setLevelFastmode.begin()) fastmode_it_type;
					t_arg.it_p =  std::static_pointer_cast<void>(std::make_shared<fastmode_it_type>(setLevelFastmode.begin()));
					t_arg.until_p =  std::static_pointer_cast<void>(std::make_shared<fastmode_it_type>(setLevelFastmode.end()));
					
					/* we'd like to do t_arg.it = data_iterator.begin() but types are different;
					 so, casting to (void*) because of that; and we remember the type in the template */
					
					for(int ii=0;ii<_num_thread;ii++)
						pthread_create (&tab_threads[ii], NULL,  thread_processLevel<elem_t, Hasher_t, Range, fastmode_it_type>, &t_arg); //&t_arg[ii]
					
					
				}
				else
				{
					for(int ii=0;ii<_num_thread;ii++)
						pthread_create (&tab_threads[ii], NULL,  thread_processLevel<elem_t, Hasher_t, Range, decltype(input_range.begin())>, &t_arg); //&t_arg[ii]
				}
				//joining
				for(int ii=0;ii<_num_thread;ii++)
				{
					pthread_join(tab_threads[ii], NULL);
				}
			}
			//printf("\ngoing to level %i  : %llu elems  %.2f %%  expected : %.2f %% \n",i,_cptLevel,100.0* _cptLevel/(float)_nelem,100.0* pow(_proba_collision,i) );

			//printf("\ncpt total processed %llu \n",_cptTotalProcessed);
			if(_fastmode && i == _fastModeLevel) //shrink to actual number of elements in set
			{
				//printf("\nresize setLevelFastmode to %lli \n",_idxLevelsetLevelFastmode);
				setLevelFastmode.resize(_idxLevelsetLevelFastmode);
			}
			delete [] tab_threads;
			
			if(_writeEachLevel)
			{
				if(i< _nb_levels-1 && i>0)
				{
					fflush(_currlevelFile);
					fclose(_currlevelFile);
				}
				
					if(i== _nb_levels- 1) //delete last file
					{
						unlink(fname_prev);
					}
			}

		}